

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caching_file_system.cpp
# Opt level: O2

unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
__thiscall
duckdb::CachingFileSystem::OpenFile(CachingFileSystem *this,OpenFileInfo *path,FileOpenFlags flags)

{
  CachedFile *args_3;
  FileOpenFlags local_30;
  
  local_30.flags = flags._8_8_;
  args_3 = ExternalFileCache::GetOrCreateCachedFile
                     ((ExternalFileCache *)(path->path)._M_string_length,(string *)flags.flags);
  make_uniq<duckdb::CachingFileHandle,duckdb::CachingFileSystem&,duckdb::OpenFileInfo_const&,duckdb::FileOpenFlags&,duckdb::ExternalFileCache::CachedFile&>
            ((duckdb *)this,(CachingFileSystem *)path,(OpenFileInfo *)flags.flags,&local_30,args_3);
  return (unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>)
         (unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>)
         this;
}

Assistant:

unique_ptr<CachingFileHandle> CachingFileSystem::OpenFile(const OpenFileInfo &path, FileOpenFlags flags) {
	return make_uniq<CachingFileHandle>(*this, path, flags, external_file_cache.GetOrCreateCachedFile(path.path));
}